

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numrange.cc
# Opt level: O0

int main(int argc,char **argv)

{
  exception *e;
  char **argv_local;
  int argc_local;
  
  test_numrange(argv[1]);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    try {
        test_numrange(argv[1]);
    } catch (std::exception& e) {
        std::cout << e.what() << std::endl;
        return 2;
    }

    return 0;
}